

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void quicly_send_datagram_frames(quicly_conn_t *conn,ptls_iovec_t *datagrams,size_t num_datagrams)

{
  long lVar1;
  void *__dest;
  undefined8 *puVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ptls_iovec_t pVar3;
  void *copied;
  size_t i;
  uint8_t *local_38;
  size_t local_30;
  long local_20;
  
  local_20 = 0;
  while (((local_20 != in_RDX && (*(long *)(in_RDI + 0x8a8) != 10)) &&
         (__dest = malloc(*(size_t *)(in_RSI + local_20 * 0x10 + 8)), __dest != (void *)0x0))) {
    memcpy(__dest,*(void **)(in_RSI + local_20 * 0x10),*(size_t *)(in_RSI + local_20 * 0x10 + 8));
    lVar1 = *(long *)(in_RDI + 0x8a8);
    *(long *)(in_RDI + 0x8a8) = lVar1 + 1;
    puVar2 = (undefined8 *)(in_RDI + 0x808 + lVar1 * 0x10);
    pVar3 = ptls_iovec_init(__dest,*(size_t *)(in_RSI + local_20 * 0x10 + 8));
    local_38 = pVar3.base;
    *puVar2 = local_38;
    local_30 = pVar3.len;
    puVar2[1] = local_30;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void quicly_send_datagram_frames(quicly_conn_t *conn, ptls_iovec_t *datagrams, size_t num_datagrams)
{
    for (size_t i = 0; i != num_datagrams; ++i) {
        if (conn->egress.datagram_frame_payloads.count == PTLS_ELEMENTSOF(conn->egress.datagram_frame_payloads.payloads))
            break;
        void *copied;
        if ((copied = malloc(datagrams[i].len)) == NULL)
            break;
        memcpy(copied, datagrams[i].base, datagrams[i].len);
        conn->egress.datagram_frame_payloads.payloads[conn->egress.datagram_frame_payloads.count++] =
            ptls_iovec_init(copied, datagrams[i].len);
    }
}